

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICrashUtil.cpp
# Opt level: O1

void updateResidual(bool piecewise,HighsLp *lp,HighsSolution *sol,
                   vector<double,_std::allocator<double>_> *residual)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  ulong uVar8;
  double dVar9;
  value_type_conflict1 local_28;
  
  pdVar4 = (residual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((residual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish != pdVar4) {
    (residual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pdVar4;
  }
  local_28 = 0.0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (residual,(long)lp->num_row_,&local_28);
  uVar3 = lp->num_row_;
  if (piecewise) {
    if (0 < (int)uVar3) {
      pdVar4 = (sol->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (residual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = 0;
      do {
        dVar1 = pdVar4[uVar8];
        dVar9 = pdVar5[uVar8];
        if (dVar1 <= dVar9) {
          dVar9 = dVar9 - dVar1;
        }
        else {
          dVar2 = pdVar6[uVar8];
          dVar9 = 0.0;
          if (dVar2 <= dVar1) {
            dVar9 = dVar1 - dVar2;
          }
        }
        pdVar7[uVar8] = dVar9;
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
    }
  }
  else if (0 < (int)uVar3) {
    pdVar4 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (sol->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (residual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      pdVar6[uVar8] = ABS(pdVar4[uVar8] - pdVar5[uVar8]);
      uVar8 = uVar8 + 1;
    } while (uVar3 != uVar8);
  }
  return;
}

Assistant:

void updateResidual(bool piecewise, const HighsLp& lp, const HighsSolution& sol,
                    std::vector<double>& residual) {
  residual.clear();
  residual.assign(lp.num_row_, 0);

  if (!piecewise) {
    assert(isEqualityProblem(lp));
    for (int row = 0; row < lp.num_row_; row++)
      residual[row] = std::fabs(lp.row_upper_[row] - sol.row_value[row]);
  } else {
    // piecewise
    for (int row = 0; row < lp.num_row_; row++) {
      double value = 0;
      if (sol.row_value[row] <= lp.row_lower_[row])
        value = lp.row_lower_[row] - sol.row_value[row];
      else if (sol.row_value[row] >= lp.row_upper_[row])
        value = sol.row_value[row] - lp.row_upper_[row];

      residual[row] = value;
    }
  }
}